

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O1

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this)

{
  IRKind IVar1;
  OpCode OVar2;
  undefined2 uVar3;
  uint uVar4;
  Opnd *pOVar5;
  _func_int **pp_Var6;
  code *pcVar7;
  SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  OpndKind OVar12;
  undefined4 *puVar13;
  Type *ppBVar14;
  Instr *pIVar15;
  BranchInstr *pBVar16;
  Type pBVar17;
  char *pcVar18;
  char *pcVar19;
  uint uVar20;
  bool bVar21;
  Instr *pIVar22;
  Instr *pIVar23;
  byte bVar24;
  bool bVar25;
  undefined1 local_68 [8];
  Iterator __iter;
  
  if (DAT_015aa3b8 == '\x01') {
    __iter.current._4_4_ =
         (undefined4)CONCAT71((int7)((ulong)this->func >> 8),(this->func->field_0x243 & 1) == 0);
  }
  else {
    __iter.current._4_4_ = 0;
  }
  pIVar15 = this->func->m_headInstr;
  if (pIVar15 != (Instr *)0x0) {
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar24 = 0;
    do {
      pIVar23 = pIVar15->m_next;
      bVar9 = Lowerer::ValidOpcodeAfterLower(pIVar15,this->func);
      if (!bVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,0x11,"(Lowerer::ValidOpcodeAfterLower(instr, this->func))",
                           "Lowerer::ValidOpcodeAfterLower(instr, this->func)");
        if (!bVar9) goto LAB_004081d2;
        *puVar13 = 0;
      }
      LowererMD::Legalize<true>(pIVar15,false);
      IVar1 = pIVar15->m_kind;
      if (IVar1 == InstrKindBranch) {
        if ((__iter.current._4_1_ != 0) && (bVar24 == 0)) {
          pIVar22 = pIVar15[1].m_next;
          if (pIVar15->m_kind != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar9) goto LAB_004081d2;
            *puVar13 = 0;
          }
          OVar2 = pIVar15->m_opcode;
          if (OVar2 < ADD) {
            bVar9 = OVar2 == MultiBr || OVar2 == Br;
          }
          else {
            bVar9 = LowererMD::IsUnconditionalBranch(pIVar15);
          }
          if (bVar9 == false) {
            if (((ulong)pIVar22[1].m_func & 0x22) == 2) {
              pIVar15 = IR::Instr::GetNextRealInstrOrLabel(pIVar15);
              if (((pIVar15->m_kind == InstrKindProfiledLabel) ||
                  (pIVar15->m_kind == InstrKindLabel)) && (((ulong)pIVar15[1].m_func & 2) != 0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                uVar20 = 0x62;
                pcVar19 = 
                "(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper))";
                pcVar18 = 
                "!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper)";
LAB_00408140:
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                   ,uVar20,pcVar19,pcVar18);
joined_r0x00408052:
                if (!bVar9) goto LAB_004081d2;
                goto LAB_00407d3e;
              }
            }
          }
          else {
            if (pIVar15->m_kind != InstrKindBranch) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
              if (!bVar9) goto LAB_004081d2;
              *puVar13 = 0;
            }
            OVar2 = pIVar15->m_opcode;
            if (OVar2 < ADD) {
              bVar9 = OVar2 == MultiBr || OVar2 == Br;
            }
            else {
              bVar9 = LowererMD::IsUnconditionalBranch(pIVar15);
            }
            if (bVar9 == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                 ,0x67,"(instr->AsBranchInstr()->IsUnconditional())",
                                 "instr->AsBranchInstr()->IsUnconditional()");
              if (!bVar9) goto LAB_004081d2;
              *puVar13 = 0;
            }
            if (pIVar22 == (Instr *)0x0) {
              if (pIVar15->m_src1 == (Opnd *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                   ,0x86,"(instr->GetSrc1())","instr->GetSrc1()");
                goto joined_r0x00408052;
              }
            }
            else if (((ulong)pIVar22[1].m_func & 0x22) == 2) {
              pIVar15 = pIVar15->m_prev;
              if (((this->func->field_0x242 & 0x40) != 0) &&
                 (bVar9 = LowererMD::IsAssign(pIVar15), bVar9)) {
                do {
                  pIVar15 = pIVar15->m_prev;
                  bVar9 = LowererMD::IsAssign(pIVar15);
                } while (bVar9);
              }
              if (pIVar15->m_opcode != DeletedNonHelperBranch) {
                if (pIVar15->m_kind == InstrKindBranch) {
                  OVar2 = pIVar15->m_opcode;
                  if (OVar2 < ADD) {
                    bVar9 = OVar2 == MultiBr || OVar2 == Br;
                  }
                  else {
                    bVar9 = LowererMD::IsUnconditionalBranch(pIVar15);
                  }
                  if (bVar9 == false) {
                    if (pIVar15->m_kind != InstrKindBranch) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar13 = 1;
                      bVar9 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                         ,0x5e,"(this->IsBranchInstr())",
                                         "Bad call to AsBranchInstr()");
                      if (!bVar9) goto LAB_004081d2;
                      *puVar13 = 0;
                    }
                    if ((((ulong)pIVar15[1].m_next[1].m_func & 2) == 0) ||
                       (pBVar16 = IR::Instr::AsBranchInstr(pIVar15),
                       (pBVar16->m_branchTarget->field_0x78 & 0x20) != 0)) goto LAB_00407fb2;
                  }
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                uVar20 = 0x82;
                pcVar19 = 
                "((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)))"
                ;
                pcVar18 = 
                "(instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert))"
                ;
                goto LAB_00408140;
              }
            }
          }
        }
      }
      else if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
        bVar10 = *(byte *)&pIVar15[1].m_func & 2;
        bVar24 = bVar10 >> 1;
        if ((bVar10 == 0 & __iter.current._4_1_) == 1) {
          if ((pIVar15->m_kind != InstrKindLabel) && (pIVar15->m_kind != InstrKindProfiledLabel)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar9) goto LAB_004081d2;
            *puVar13 = 0;
          }
          if (((ulong)pIVar15[1].m_func & 0x20) == 0) {
            if ((pIVar15->m_kind != InstrKindLabel) && (pIVar15->m_kind != InstrKindProfiledLabel))
            {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar9) goto LAB_004081d2;
              *puVar13 = 0;
            }
            bVar25 = true;
            bVar9 = false;
            bVar21 = false;
            pIVar23 = pIVar15;
            do {
              pIVar22 = pIVar23;
              local_68 = (undefined1  [8])(pIVar22 + 1);
              __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                            local_68;
              do {
                if (__iter.list ==
                    (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar11 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar11) goto LAB_004081d2;
                  *puVar13 = 0;
                }
                __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                              ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                pSVar8 = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
                if ((undefined1  [8])__iter.list == local_68) break;
                ppBVar14 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator
                           ::Data((Iterator *)local_68);
                pBVar17 = *ppBVar14;
                do {
                  pBVar17 = (Type)(pBVar17->super_Instr).m_prev;
                  bVar21 = true;
                  if (pBVar17 == (Type)0x0) goto LAB_00407842;
                  IVar1 = (pBVar17->super_Instr).m_kind;
                } while ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel));
                if (((ulong)pBVar17[1].super_Instr._vptr_Instr & 2) == 0) {
LAB_00407842:
                  bVar10 = 0;
                }
                else {
                  bVar21 = bVar9;
                  if ((*ppBVar14)->m_isHelperToNonHelperBranch != false) {
                    bVar21 = true;
                  }
                  bVar10 = (*ppBVar14)->m_isHelperToNonHelperBranch ^ 1;
                }
                bVar25 = false;
                pSVar8 = __iter.list;
                bVar9 = bVar21;
              } while (bVar10 != 0);
              __iter.list = pSVar8;
              pIVar23 = pIVar22->m_next;
              if ((pIVar23->m_kind != InstrKindProfiledLabel) && (pIVar23->m_kind != InstrKindLabel)
                 ) break;
              if (((this->func->field_0x242 & 0x80) == 0) &&
                 (((ulong)pIVar23[1].m_func & 0x22) == 2)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                    ,0x3a,
                                    "(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper)"
                                    ,
                                    "func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper"
                                   );
                if (!bVar11) goto LAB_004081d2;
                *puVar13 = 0;
              }
            } while (((ulong)pIVar23[1].m_func & 2) == 0);
            pIVar23 = pIVar22->m_next;
            if (((!bVar21) &&
                (pIVar15 = IR::Instr::GetNextRealInstrOrLabel(pIVar15),
                pIVar15->m_kind != InstrKindExit)) && (!bVar25)) {
              pIVar15 = IR::Instr::GetPrevRealInstrOrLabel(pIVar22);
              if (pIVar15->m_kind == InstrKindBranch) {
                OVar2 = pIVar15->m_opcode;
                if (OVar2 < ADD) {
                  bVar9 = OVar2 == MultiBr || OVar2 == Br;
                }
                else {
                  bVar9 = LowererMD::IsUnconditionalBranch(pIVar15);
                }
                if (bVar9 != false) goto LAB_00407fb2;
              }
              bVar9 = OpCodeAttr::HasFallThrough(pIVar15->m_opcode);
              if ((bVar9) &&
                 ((pIVar15->m_kind != InstrKindBranch ||
                  (*(char *)((long)&pIVar15[1]._vptr_Instr + 2) == '\0')))) {
                for (; pIVar15 != (Instr *)0x0; pIVar15 = pIVar15->m_prev) {
                  if ((pIVar15->m_kind == InstrKindLabel) ||
                     (pIVar15->m_kind == InstrKindProfiledLabel)) {
                    if (((ulong)pIVar15[1].m_func & 2) == 0) goto LAB_00407fb2;
                    break;
                  }
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                uVar20 = 0x51;
                pcVar19 = 
                "(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper)"
                ;
                pcVar18 = "Inconsistency in Helper label annotations";
                goto LAB_00408140;
              }
            }
          }
        }
      }
      else {
        Check(this,pIVar15->m_dst);
        Check(this,pIVar15->m_src1);
        Check(this,pIVar15->m_src2);
        bVar9 = EncoderMD::IsOPEQ(pIVar15);
        if (bVar9) {
          bVar9 = IR::Opnd::IsEqual(pIVar15->m_dst,pIVar15->m_src1);
          if (!bVar9) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x97,"(instr->GetDst()->IsEqual(instr->GetSrc1()))",
                               "instr->GetDst()->IsEqual(instr->GetSrc1())");
            if (!bVar9) goto LAB_004081d2;
            *puVar13 = 0;
          }
          if (((pIVar15->m_src2 != (Opnd *)0x0) &&
              (TySize[pIVar15->m_dst->m_type] != TySize[pIVar15->m_src2->m_type])) &&
             (((bVar9 = EncoderMD::IsSHIFT(pIVar15), !bVar9 &&
               (uVar3 = pIVar15->m_opcode, 2 < (ushort)(uVar3 - 0x3e1))) ||
              (TySize[pIVar15->m_src2->m_type] != 1)))) {
            if (((pIVar15->m_src2->m_type == TyVar) && (TySize[pIVar15->m_dst->m_type] == 4)) &&
               (OVar12 = IR::Opnd::GetKind(pIVar15->m_src2), OVar12 == OpndKindAddr)) {
              pOVar5 = pIVar15->m_src2;
              OVar12 = IR::Opnd::GetKind(pOVar5);
              if (OVar12 != OpndKindAddr) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
                if (!bVar9) goto LAB_004081d2;
                *puVar13 = 0;
              }
              pp_Var6 = pOVar5[2]._vptr_Opnd;
              if ((_func_int **)(long)(int)pp_Var6 == pp_Var6) goto LAB_00407bbb;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0xa0,
                               "(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))))"
                               ,
                               "!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address)))"
                              );
            if (!bVar9) goto LAB_004081d2;
            *puVar13 = 0;
          }
        }
LAB_00407bbb:
        bVar9 = LowererMD::IsAssign(pIVar15);
        if ((bVar9) && (TySize[pIVar15->m_dst->m_type] != TySize[pIVar15->m_src1->m_type])) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xa7,
                             "(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())"
                             ,
                             "!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()"
                            );
          if (!bVar9) goto LAB_004081d2;
          *puVar13 = 0;
        }
        if (pIVar15->m_opcode - 0x3e6 < 0x10) {
          pOVar5 = pIVar15->m_dst;
          if (pIVar15->m_src2 == (Opnd *)0x0) {
            OVar12 = IR::Opnd::GetKind(pOVar5);
            if (OVar12 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar9) goto LAB_004081d2;
              *puVar13 = 0;
            }
            if (*(byte *)((long)&pOVar5[1].m_valueType.field_0.bits + 1) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              uVar20 = 0xc5;
              pcVar19 = "(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG)";
              pcVar18 = "instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG";
              goto LAB_00407d26;
            }
          }
          else {
            bVar9 = IR::Opnd::IsEqual(pOVar5,pIVar15->m_src1);
            if (!bVar9) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              uVar20 = 0xc0;
              pcVar19 = "(instr->GetDst()->IsEqual(instr->GetSrc1()))";
              pcVar18 = "instr->GetDst()->IsEqual(instr->GetSrc1())";
LAB_00407d26:
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                 ,uVar20,pcVar19,pcVar18);
              goto LAB_00407d30;
            }
          }
        }
        else if ((pIVar15->m_opcode == CALL) &&
                (uVar4 = *(uint *)&pIVar15->m_func->field_0x240,
                -1 < (short)uVar4 && (uVar4 & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xc9,"(!instr->m_func->IsTrueLeaf())","!instr->m_func->IsTrueLeaf()");
LAB_00407d30:
          if (bVar9 == false) {
LAB_004081d2:
            pcVar7 = (code *)invalidInstructionException();
            (*pcVar7)();
          }
LAB_00407d3e:
          *puVar13 = 0;
        }
      }
LAB_00407fb2:
      pIVar15 = pIVar23;
    } while (pIVar15 != (Instr *)0x0);
  }
  return;
}

Assistant:

void
DbCheckPostLower::Check()
{
    bool doOpHelperCheck = Js::Configuration::Global.flags.CheckOpHelpers && !this->func->isPostLayout;
    bool isInHelperBlock = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        Assert(Lowerer::ValidOpcodeAfterLower(instr, this->func));
        LowererMD::Legalize</*verify*/true>(instr);
        switch(instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
            if (doOpHelperCheck && !isInHelperBlock && !instr->AsLabelInstr()->m_noHelperAssert)
            {
                bool foundNonHelperPath = false;
                bool isDeadLabel = true;

                IR::LabelInstr* labelInstr = instr->AsLabelInstr();

                while (1)
                {
                    FOREACH_SLIST_ENTRY(IR::BranchInstr *, branchInstr, &labelInstr->labelRefs)
                    {
                        isDeadLabel = false;
                        IR::Instr *instrPrev = branchInstr->m_prev;
                        while (instrPrev && !instrPrev->IsLabelInstr())
                        {
                            instrPrev = instrPrev->m_prev;
                        }
                        if (!instrPrev || !instrPrev->AsLabelInstr()->isOpHelper || branchInstr->m_isHelperToNonHelperBranch)
                        {
                            foundNonHelperPath = true;
                            break;
                        }
                    } NEXT_SLIST_ENTRY;

                    if (!labelInstr->m_next->IsLabelInstr())
                    {
                        break;
                    }
                    IR::LabelInstr *const nextLabel = labelInstr->m_next->AsLabelInstr();

                    // It is generally not expected for a non-helper label to be immediately followed by a helper label. Some
                    // special cases may flag the helper label with m_noHelperAssert = true. Peeps can cause non-helper blocks
                    // to fall through into helper blocks, so skip this check after peeps.
                    Assert(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper);

                    if(nextLabel->isOpHelper)
                    {
                        break;
                    }
                    labelInstr = nextLabel;
                }

                instrNext = labelInstr->m_next;

                // This label is unreachable or at least one path to it is not from a helper block.

                if (!foundNonHelperPath && !instr->GetNextRealInstrOrLabel()->IsExitInstr() && !isDeadLabel)
                {
                    IR::Instr *prevInstr = labelInstr->GetPrevRealInstrOrLabel();
                    if (prevInstr->HasFallThrough() && !(prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->m_isHelperToNonHelperBranch))
                    {
                        while (prevInstr && !prevInstr->IsLabelInstr())
                        {
                            prevInstr = prevInstr->m_prev;
                        }

                        AssertMsg(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper, "Inconsistency in Helper label annotations");
                    }
                }
            }
            break;
        }
        case IR::InstrKindBranch:
            if (doOpHelperCheck && !isInHelperBlock)
            {
                IR::LabelInstr *targetLabel = instr->AsBranchInstr()->GetTarget();

                // This branch needs a path to a non-helper block.
                if (instr->AsBranchInstr()->IsConditional())
                {
                    if (targetLabel->isOpHelper && !targetLabel->m_noHelperAssert)
                    {
                        IR::Instr *instrNextDebug = instr->GetNextRealInstrOrLabel();
                        Assert(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper));
                    }
                }
                else
                {
                    Assert(instr->AsBranchInstr()->IsUnconditional());

                    if (targetLabel)
                    {
                        if (!targetLabel->isOpHelper || targetLabel->m_noHelperAssert)
                        {
                            break;
                        }
                        // Target is opHelper

                        IR::Instr *instrPrev = instr->m_prev;

                        if (this->func->isPostRegAlloc)
                        {
                            while (LowererMD::IsAssign(instrPrev))
                            {
                                // Skip potential register allocation compensation code
                                instrPrev = instrPrev->m_prev;
                            }
                        }

                        if (instrPrev->m_opcode == Js::OpCode::DeletedNonHelperBranch)
                        {
                            break;
                        }

                        Assert((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional()
                            && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)));
                    }
                    else
                    {
                        Assert(instr->GetSrc1());
                    }
                }
            }
            break;

        default:
            this->Check(instr->GetDst());
            this->Check(instr->GetSrc1());
            this->Check(instr->GetSrc2());

#if defined(_M_IX86) || defined(_M_X64)
            // for op-eq's and assignment operators, make  sure the types match
            // for shift operators make sure the types match and the third is an 8-bit immediate
            // for cmp operators similarly check types are same
            if (EncoderMD::IsOPEQ(instr))
            {
                Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));

#if defined(_M_X64)
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BTS ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) ||
                    // Is src2 is TyVar and src1 is TyInt32/TyUint32, make sure the address fits in 32 bits 
                        (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 &&
                         instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))));
#else
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1));
#endif
            }
            Assert(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());
            Assert(instr->m_opcode != Js::OpCode::CMP || instr->GetSrc1()->GetType() == instr->GetSrc1()->GetType());

            switch (instr->m_opcode)
            {
            case Js::OpCode::CMOVA:
            case Js::OpCode::CMOVAE:
            case Js::OpCode::CMOVB:
            case Js::OpCode::CMOVBE:
            case Js::OpCode::CMOVE:
            case Js::OpCode::CMOVG:
            case Js::OpCode::CMOVGE:
            case Js::OpCode::CMOVL:
            case Js::OpCode::CMOVLE:
            case Js::OpCode::CMOVNE:
            case Js::OpCode::CMOVNO:
            case Js::OpCode::CMOVNP:
            case Js::OpCode::CMOVNS:
            case Js::OpCode::CMOVO:
            case Js::OpCode::CMOVP:
            case Js::OpCode::CMOVS:
                if (instr->GetSrc2())
                {
                    // CMOV inserted before regAlloc need a fake use of the dst register to make up for the
                    // fact that the CMOV may not set the dst. Regalloc needs to assign the same physical register for dst and src1.
                    Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));
                }
                else
                {
                    // These must have been inserted post-regalloc.
                    Assert(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG);
                }
                break;
            case Js::OpCode::CALL:
                Assert(!instr->m_func->IsTrueLeaf());
                break;
            }
#endif
        }
    } NEXT_INSTR_IN_FUNC_EDITING;
}